

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QWidget_*,_QPersistentModelIndex>::emplace_helper<QPersistentModelIndex>
          (QHash<QWidget_*,_QPersistentModelIndex> *this,QWidget **key,QPersistentModelIndex *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  iterator<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *in_RDX;
  Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QWidget*,QPersistentModelIndex>>::findOrInsert<QWidget*>
            (in_RSI,(QWidget **)in_RDX);
  QHashPrivate::iterator<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_>::node(in_RDX);
  QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>::createInPlace<QPersistentModelIndex>
            ((Node<QWidget_*,_QPersistentModelIndex> *)in_stack_ffffffffffffff90,
             (QWidget **)in_stack_ffffffffffffff88,(QPersistentModelIndex *)0x82a683);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }